

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O3

string * HRRVarName(string *__return_storage_ptr__,string *brastr,int am3,int am4)

{
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"HRR","");
  StringBuilder<char[6],std::__cxx11::string_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (&local_68,(char (*) [6])"INT__",brastr,(char (*) [2])0x149ccc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + am3,
             (char (*) [2])0x149ccc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + am4);
  if (local_48._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_68._M_string_length;
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,&local_48,(char (*) [2])0x149ccc,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string HRRVarName(const std::string & brastr, int am3, int am4)
{
    return ArrVarName(brastr, am3, am4, "HRR");
}